

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O0

secp256k1_xonly_pubkey *
cfd::core::ParseXOnlyPubkey(secp256k1_xonly_pubkey *__return_storage_ptr__,SchnorrPubkey *pubkey)

{
  int iVar1;
  secp256k1_context_struct *ctx_00;
  uchar *input32;
  undefined8 uVar2;
  undefined4 in_stack_ffffffffffffff50;
  CfdError error_code;
  CfdException *this;
  allocator local_81;
  string local_80 [48];
  ByteData local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  int local_1c;
  secp256k1_context_struct *psStack_18;
  int ret;
  secp256k1_context_struct *ctx;
  SchnorrPubkey *pubkey_local;
  
  this = (CfdException *)__return_storage_ptr__;
  ctx = (secp256k1_context_struct *)pubkey;
  ctx_00 = wally_get_secp_context();
  psStack_18 = ctx_00;
  SchnorrPubkey::GetData(&local_50,(SchnorrPubkey *)ctx);
  ByteData::GetBytes(&local_38,&local_50);
  input32 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x49b320);
  iVar1 = secp256k1_xonly_pubkey_parse(ctx_00,__return_storage_ptr__,input32);
  error_code = (CfdError)((ulong)__return_storage_ptr__ >> 0x20);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff50));
  ByteData::~ByteData((ByteData *)0x49b350);
  if (iVar1 != 1) {
    local_1c = iVar1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_80,"Could not parse xonly pubkey",&local_81);
    CfdException::CfdException(this,error_code,(string *)CONCAT44(iVar1,in_stack_ffffffffffffff50));
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return (secp256k1_xonly_pubkey *)this;
}

Assistant:

secp256k1_xonly_pubkey ParseXOnlyPubkey(const SchnorrPubkey& pubkey) {
  auto ctx = wally_get_secp_context();
  secp256k1_xonly_pubkey xonly_pubkey;

  auto ret = secp256k1_xonly_pubkey_parse(
      ctx, &xonly_pubkey, pubkey.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not parse xonly pubkey");
  }

  return xonly_pubkey;
}